

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

void __thiscall IDLExport::IDLExport(IDLExport *this)

{
  _Rb_tree_header *p_Var1;
  
  *(undefined ***)this = &PTR_begin_0011d7c0;
  (this->m_namespace)._M_dataplus._M_p = (pointer)&(this->m_namespace).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_namespace,"/","");
  (this->m_ns_prefix)._M_dataplus._M_p = (pointer)&(this->m_ns_prefix).field_2;
  (this->m_ns_prefix)._M_string_length = 0;
  (this->m_ns_prefix).field_2._M_local_buf[0] = '\0';
  (this->m_ns_suffix)._M_dataplus._M_p = (pointer)&(this->m_ns_suffix).field_2;
  (this->m_ns_suffix)._M_string_length = 0;
  (this->m_ns_suffix).field_2._M_local_buf[0] = '\0';
  (this->m_indent)._M_dataplus._M_p = (pointer)&(this->m_indent).field_2;
  (this->m_indent)._M_string_length = 0;
  (this->m_indent).field_2._M_local_buf[0] = '\0';
  this->m_opaque_as_any = false;
  p_Var1 = &(this->m_selected_types)._M_t._M_impl.super__Rb_tree_header;
  (this->m_selected_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_selected_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_selected_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_selected_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_selected_types)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_typedefs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_typedefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_typedefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_typedefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_typedefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_typedefs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_exported_typedefs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_exported_typedefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_exported_typedefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_exported_typedefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_exported_typedefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_exported_typedefs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

IDLExport::IDLExport()
    : m_namespace("/"), m_opaque_as_any(false) {}